

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int connectionIsBusy(sqlite3 *db)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (db->pVdbe == (Vdbe *)0x0) {
    uVar3 = 0;
    uVar2 = (ulong)(uint)db->nDb;
    if (db->nDb < 1) {
      uVar2 = uVar3;
    }
    while( true ) {
      if (uVar2 * 0x20 == uVar3) {
        return 0;
      }
      lVar1 = *(long *)((long)&db->aDb->pBt + uVar3);
      if ((lVar1 != 0) && (*(int *)(lVar1 + 0x18) != 0)) break;
      uVar3 = uVar3 + 0x20;
    }
  }
  return 1;
}

Assistant:

static int connectionIsBusy(sqlite3 *db){
  int j;
  assert( sqlite3_mutex_held(db->mutex) );
  if( db->pVdbe ) return 1;
  for(j=0; j<db->nDb; j++){
    Btree *pBt = db->aDb[j].pBt;
    if( pBt && sqlite3BtreeIsInBackup(pBt) ) return 1;
  }
  return 0;
}